

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Accumulate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  size_type sVar4;
  undefined8 uVar5;
  uchar *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  reference puVar10;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  iterator v;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  uint8_t colorCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint32_t *in_stack_ffffffffffffff98;
  uint32_t *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  byte *pbVar11;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)in_stack_ffffffffffffffb0._M_current,
             (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,
             (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa0);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_R9);
  if (sVar4 != in_ECX * (uint)bVar1 * in_R8D) {
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  pbVar7 = puVar6 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar2);
  pbVar8 = pbVar7 + in_R8D * uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff88);
  while (pbVar7 != pbVar8) {
    pbVar9 = pbVar7 + in_ECX * (uint)bVar1;
    pbVar11 = pbVar7;
    while (pbVar7 != pbVar9) {
      uVar3 = (uint)*pbVar7;
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)&stack0xffffffffffffffb0);
      *puVar10 = uVar3 + *puVar10;
      pbVar7 = pbVar7 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)&stack0xffffffffffffffb0);
    }
    pbVar7 = pbVar11 + uVar2;
  }
  return;
}

Assistant:

void Accumulate( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & result )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();
        width = width * colorCount;

        OptimiseRoi( width, height, image );

        if( result.size() != width * height )
            throw imageException( "Array size is not equal to image ROI (width * height) size" );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;
        std::vector < uint32_t >::iterator v = result.begin();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX, ++v )
                *v += (*imageX);
        }
    }